

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

void __thiscall gvr::PLYElement::readData(PLYElement *this,streambuf *in)

{
  PLYProperty *pPVar1;
  streambuf *in_RDI;
  size_t k;
  long i;
  PLYProperty *pPVar2;
  PLYProperty *this_00;
  long local_18;
  
  for (local_18 = 0; local_18 < *(long *)(in_RDI + 0x20); local_18 = local_18 + 1) {
    pPVar2 = (PLYProperty *)0x0;
    while( true ) {
      this_00 = pPVar2;
      pPVar1 = (PLYProperty *)
               std::
               vector<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
               ::size((vector<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                       *)(in_RDI + 0x28));
      if (pPVar1 <= pPVar2) break;
      std::
      vector<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
      ::operator[]((vector<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                    *)(in_RDI + 0x28),(size_type)this_00);
      anon_unknown_3::PLYProperty::readData(this_00,in_RDI,(int)((ulong)pPVar2 >> 0x20));
      pPVar2 = (PLYProperty *)((long)&this_00->enc + 1);
    }
  }
  return;
}

Assistant:

void PLYElement::readData(std::streambuf *in)
{
  for (long i=0; i<size; i++)
  {
    for (size_t k=0; k<list.size(); k++)
    {
      list[k].readData(in, i);
    }
  }
}